

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::BaseBuilder::embedLabel(BaseBuilder *this,Label *label,size_t dataSize)

{
  uint32_t uVar1;
  Error EVar2;
  Error extraout_EAX;
  Error EVar3;
  ulong uVar4;
  BaseNode *node;
  size_t sStack_28;
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    return 5;
  }
  if ((dataSize != 0) &&
     ((8 < dataSize ||
      (uVar4 = dataSize - (dataSize >> 1 & 0x5555555555555555),
      uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333),
      1 < (byte)(((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38))))) {
    EVar2 = BaseEmitter::reportError(&this->super_BaseEmitter,2,(char *)0x0);
    return EVar2;
  }
  if (*(long *)&this->_allocator == 0) {
    embedLabel();
    EVar2 = extraout_EAX;
  }
  else {
    uVar1 = (label->super_Operand).super_Operand_._baseId;
    node = (BaseNode *)ZoneAllocator::_alloc(&this->_allocator,0x38,&sStack_28);
    EVar3 = 0;
    EVar2 = 0;
    if (node != (BaseNode *)0x0) {
      *(undefined8 *)node = 0;
      *(undefined8 *)(node + 8) = 0;
      node[0x10] = (BaseNode)0x6;
      node[0x11] = (BaseNode)(this->_nodeFlags | kIsData);
      *(undefined8 *)(node + 0x12) = 0;
      *(undefined8 *)(node + 0x1a) = 0;
      *(undefined8 *)(node + 0x20) = 0;
      *(undefined8 *)(node + 0x28) = 0;
      *(uint32_t *)(node + 0x30) = uVar1;
      *(int *)(node + 0x34) = (int)dataSize;
      goto LAB_00117c16;
    }
  }
  EVar3 = EVar2;
  node = (BaseNode *)0x0;
LAB_00117c16:
  if (node == (BaseNode *)0x0) {
    EVar3 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
  }
  if (EVar3 == 0) {
    addNode(this,node);
    EVar3 = 0;
  }
  return EVar3;
}

Assistant:

Error BaseBuilder::embedLabel(const Label& label, size_t dataSize) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (!BaseBuilder_checkDataSize(dataSize))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  EmbedLabelNode* node;
  ASMJIT_PROPAGATE(_newNodeT<EmbedLabelNode>(&node, label.id(), uint32_t(dataSize)));

  addNode(node);
  return kErrorOk;
}